

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9VmIsCallable(jx9_vm *pVm,jx9_value *pValue)

{
  int iVar1;
  char *pKey;
  SyHashEntry *pSVar2;
  int nLen;
  
  iVar1 = 0;
  if ((pValue->iFlags & 1) != 0) {
    pKey = jx9_value_to_string(pValue,&nLen);
    pSVar2 = SyHashGet(&pVm->hFunction,pKey,nLen);
    if ((pSVar2 == (SyHashEntry *)0x0) &&
       (pSVar2 = SyHashGet(&pVm->hHostFunction,pKey,nLen), pSVar2 == (SyHashEntry *)0x0)) {
      iVar1 = 0;
    }
    else {
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

JX9_PRIVATE int jx9VmIsCallable(jx9_vm *pVm, jx9_value *pValue)
{
	int res = 0;
	if( pValue->iFlags & MEMOBJ_STRING ){
		const char *zName;
		int nLen;
		/* Extract the name */
		zName = jx9_value_to_string(pValue, &nLen);
		/* Perform the lookup */
		if( SyHashGet(&pVm->hFunction, (const void *)zName, (sxu32)nLen) != 0 ||
			SyHashGet(&pVm->hHostFunction, (const void *)zName, (sxu32)nLen) != 0 ){
				/* Function is callable */
				res = 1;
		}
	}
	return res;
}